

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool mountain_top_possible(wchar_t place)

{
  level_conflict *plVar1;
  level *current;
  wchar_t place_local;
  
  plVar1 = world->levels;
  if (plVar1[place].up == (char *)0x0) {
    if (plVar1[place].topography == TOP_CAVE) {
      current._7_1_ = false;
    }
    else if (plVar1[place].topography == TOP_MOUNTAINTOP) {
      current._7_1_ = false;
    }
    else if (plVar1[place].topography == TOP_SWAMP) {
      current._7_1_ = false;
    }
    else if (plVar1[place].topography == TOP_TOWN) {
      current._7_1_ = false;
    }
    else if (plVar1[place].topography == TOP_VALLEY) {
      current._7_1_ = false;
    }
    else {
      current._7_1_ = true;
    }
  }
  else {
    current._7_1_ = false;
  }
  return current._7_1_;
}

Assistant:

bool mountain_top_possible(int place)
{
	struct level *current = &world->levels[place];

	if (current->up) {
		return false;
	} else if (current->topography == TOP_CAVE) {
		return false;
	} else if (current->topography == TOP_MOUNTAINTOP) {
		return false;
	} else if (current->topography == TOP_SWAMP) {
		return false;
	} else if (current->topography == TOP_TOWN) {
		return false;
	} else if (current->topography == TOP_VALLEY) {
		return false;
	}
	return true;
}